

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadVariantSelectionMap(CrateReader *this,VariantSelectionMap *d)

{
  bool bVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  uint64_t sz;
  string value;
  ostringstream ss_e;
  ulong local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [11];
  
  if (d == (VariantSelectionMap *)0x0) {
    return false;
  }
  bVar1 = StreamReader::read8(this->_sr,&local_1f0);
  if (bVar1) {
    if ((this->_config).maxVariantsMapElements < local_1f0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadVariantSelectionMap");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6be);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,
                                 "The number of elements for VariantsMap data is too large. Max = ")
      ;
      std::__cxx11::to_string(&local_1e8,(this->_config).maxVariantsMapElements);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
      poVar2 = ::std::operator<<(poVar2,", but got ");
      std::__cxx11::to_string(&local_1c8,local_1f0);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1c8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&this->_err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    else {
      uVar3 = 0;
      while( true ) {
        if (local_1f0 <= uVar3) {
          return true;
        }
        local_1a8[0]._M_string_length = 0;
        local_1a8[0].field_2._M_local_buf[0] = '\0';
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        bVar1 = ReadString(this,local_1a8);
        if (!bVar1) break;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_local_buf[0] = '\0';
        bVar1 = ReadString(this,(string *)&local_1e8);
        if (!bVar1) {
          ::std::__cxx11::string::_M_dispose();
          break;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)d,local_1a8,(string *)&local_1e8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        uVar3 = uVar3 + 1;
      }
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  return false;
}

Assistant:

bool CrateReader::ReadVariantSelectionMap(VariantSelectionMap *d) {

  if (!d) {
    return false;
  }

  // map<string, string>

  // n
  // [key, value] * n

  uint64_t sz;
  if (!_sr->read8(&sz)) {
    _err += "Failed to read the number of elements for VariantsMap data.\n";
    return false;
  }

  if (sz > _config.maxVariantsMapElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "The number of elements for VariantsMap data is too large. Max = " << std::to_string(_config.maxVariantsMapElements) << ", but got " << std::to_string(sz));
  }

  for (size_t i = 0; i < sz; i++) {
    std::string key;
    if (!ReadString(&key)) {
      return false;
    }

    std::string value;
    if (!ReadString(&value)) {
      return false;
    }

    // TODO: Duplicate key check?
    d->emplace(key, value);
  }

  return true;
}